

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxUnaryNotBoolean::Resolve(FxUnaryNotBoolean *this,FCompileContext *ctx)

{
  BYTE BVar1;
  PString *pPVar2;
  PBool *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  FxBoolCast *this_00;
  FxExpression *pFVar5;
  FxUnaryNotBoolean *pFVar6;
  FScriptPosition *other;
  bool bVar7;
  FString local_30;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  pFVar5 = this->Operand;
  if (pFVar5 != (FxExpression *)0x0) {
    iVar4 = (*pFVar5->_vptr_FxExpression[2])(pFVar5,ctx);
    this->Operand = (FxExpression *)CONCAT44(extraout_var,iVar4);
  }
  if (this->Operand == (FxExpression *)0x0) {
LAB_00525b1a:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxUnaryNotBoolean *)0x0;
  }
  else {
    if (this->Operand->ValueType != (PType *)TypeBool) {
      this_00 = (FxBoolCast *)FMemArena::Alloc(&FxAlloc,0x38);
      pFVar5 = this->Operand;
      (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition
                (&(this_00->super_FxExpression).ScriptPosition,&pFVar5->ScriptPosition);
      (this_00->super_FxExpression).ValueType = (PType *)0x0;
      (this_00->super_FxExpression).isresolved = false;
      (this_00->super_FxExpression).NeedResult = true;
      (this_00->super_FxExpression).ExprType = EFX_BoolCast;
      (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxBoolCast_0070f548;
      this_00->basex = pFVar5;
      (this_00->super_FxExpression).ValueType = (PType *)TypeBool;
      this_00->NeedValue = true;
      this->Operand = (FxExpression *)this_00;
      pFVar5 = FxBoolCast::Resolve(this_00,ctx);
      this->Operand = pFVar5;
      if (pFVar5 == (FxExpression *)0x0) goto LAB_00525b1a;
    }
    iVar4 = (*this->Operand->_vptr_FxExpression[3])();
    if ((char)iVar4 == '\0') {
      (this->super_FxExpression).ValueType = (PType *)TypeBool;
    }
    else {
      pPVar2 = (PString *)this->Operand[1]._vptr_FxExpression;
      other = &this->Operand[1].ScriptPosition;
      if (pPVar2 == TypeString) {
        FString::AttachToOther(&local_30,&other->FileName);
      }
      else {
        local_30.Chars = (other->FileName).Chars;
      }
      BVar1 = (pPVar2->super_PBasicType).super_PType.RegType;
      if (BVar1 == '\x01') {
        bVar7 = (bool)(-((double)local_30.Chars != 0.0) & 1);
      }
      else if (BVar1 == '\0') {
        bVar7 = (int)local_30.Chars != 0;
      }
      else {
        bVar7 = false;
      }
      if (pPVar2 == TypeString) {
        FString::~FString(&local_30);
      }
      pFVar6 = (FxUnaryNotBoolean *)FMemArena::Alloc(&FxAlloc,0x38);
      (pFVar6->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition
                (&(pFVar6->super_FxExpression).ScriptPosition,
                 &(this->super_FxExpression).ScriptPosition);
      (pFVar6->super_FxExpression).ValueType = (PType *)0x0;
      (pFVar6->super_FxExpression).isresolved = false;
      (pFVar6->super_FxExpression).NeedResult = true;
      (pFVar6->super_FxExpression).ExprType = EFX_Constant;
      (pFVar6->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_007113e8;
      pFVar6->Operand = (FxExpression *)TypeSInt32;
      *(undefined4 *)&pFVar6[1].super_FxExpression._vptr_FxExpression = 0;
      pPVar3 = TypeBool;
      pFVar6->Operand = (FxExpression *)TypeBool;
      (pFVar6->super_FxExpression).ValueType = (PType *)pPVar3;
      *(uint *)&pFVar6[1].super_FxExpression._vptr_FxExpression = (uint)(bVar7 ^ 1);
      (pFVar6->super_FxExpression).isresolved = true;
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      this = pFVar6;
    }
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxUnaryNotBoolean::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	if (Operand->ValueType != TypeBool)
	{
		Operand = new FxBoolCast(Operand);
		SAFE_RESOLVE(Operand, ctx);
	}

	if (Operand->isConstant())
	{
		bool result = !static_cast<FxConstant *>(Operand)->GetValue().GetBool();
		FxExpression *e = new FxConstant(result, ScriptPosition);
		delete this;
		return e;
	}

	ValueType = TypeBool;
	return this;
}